

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O2

void __thiscall
cmFileWatcher::cmFileWatcher(cmFileWatcher *this,cmRealDirectoryWatcher *p,string *ps,Callback *cb)

{
  _Manager_type p_Var1;
  initializer_list<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>
  __l;
  allocator_type local_59;
  _Any_data local_58;
  _Manager_type local_48;
  _Invoker_type local_40;
  
  (this->super_cmIBaseWatcher)._vptr_cmIBaseWatcher = (_func_int **)&PTR__cmFileWatcher_00566b10;
  this->Parent = p;
  std::__cxx11::string::string((string *)&this->PathSegment,(string *)ps);
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_48 = (_Manager_type)0x0;
  local_40 = cb->_M_invoker;
  p_Var1 = (cb->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_58._M_unused._0_8_ = (undefined8)*(undefined8 *)&(cb->super__Function_base)._M_functor;
    local_58._8_8_ = *(undefined8 *)((long)&(cb->super__Function_base)._M_functor + 8);
    (cb->super__Function_base)._M_manager = (_Manager_type)0x0;
    cb->_M_invoker = (_Invoker_type)0x0;
    local_48 = p_Var1;
  }
  __l._M_len = 1;
  __l._M_array = (iterator)&local_58;
  std::
  vector<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>,_std::allocator<std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_int)>_>_>
  ::vector(&this->CbList,__l,&local_59);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  if (p != (cmRealDirectoryWatcher *)0x0) {
    if (ps->_M_string_length != 0) {
      cmVirtualDirectoryWatcher::AddChildWatcher
                (&p->super_cmVirtualDirectoryWatcher,ps,&this->super_cmIBaseWatcher);
      return;
    }
    __assert_fail("!ps.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                  ,0xe9,
                  "cmFileWatcher::cmFileWatcher(cmRealDirectoryWatcher *, const std::string &, cmFileMonitor::Callback)"
                 );
  }
  __assert_fail("p",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmFileMonitor.cxx"
                ,0xe8,
                "cmFileWatcher::cmFileWatcher(cmRealDirectoryWatcher *, const std::string &, cmFileMonitor::Callback)"
               );
}

Assistant:

cmFileWatcher(cmRealDirectoryWatcher* p, const std::string& ps,
                cmFileMonitor::Callback cb)
    : Parent(p)
    , PathSegment(ps)
    , CbList({ std::move(cb) })
  {
    assert(p);
    assert(!ps.empty());
    p->AddChildWatcher(ps, this);
  }